

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O1

PatternList *
parse_short(PatternList *__return_storage_ptr__,Tokens *tokens,
           vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  Variant *pVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pOVar5;
  pointer __n;
  vector<docopt::Option,std::allocator<docopt::Option>> *pvVar6;
  int iVar7;
  string *psVar8;
  long *plVar9;
  runtime_error *prVar10;
  Option *pOVar11;
  byte *pbVar12;
  _Alloc_hider this;
  Option *option;
  pointer pOVar13;
  string local_180;
  string local_160;
  char *local_140;
  size_type local_138;
  char local_130;
  undefined7 uStack_12f;
  undefined8 uStack_128;
  vector<docopt::Option,std::allocator<docopt::Option>> *local_120;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *__range2;
  shared_ptr<docopt::Option> o;
  undefined1 local_f8 [8];
  string shortOpt;
  string token;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> similar;
  PatternList *ret;
  string error;
  Option *local_58;
  value val;
  
  Tokens::pop_abi_cxx11_((string *)((long)&shortOpt.field_2 + 8),tokens);
  pVVar1 = &val.variant;
  local_58 = (Option *)pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-","");
  if ((token._M_dataplus._M_p < (ulong)val._0_8_) ||
     ((val._0_8_ != 0 &&
      (iVar7 = bcmp(local_58,(void *)shortOpt.field_2._8_8_,val._0_8_), iVar7 != 0)))) {
    __assert_fail("starts_with(token, \"-\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/vendor/docopt/docopt.cpp"
                  ,0x120,"PatternList parse_short(Tokens &, std::vector<Option> &)");
  }
  if (local_58 != (Option *)pVVar1) {
    operator_delete(local_58);
  }
  local_58 = (Option *)pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"--","");
  if (((ulong)val._0_8_ <= token._M_dataplus._M_p) &&
     ((val._0_8_ == 0 ||
      (iVar7 = bcmp(local_58,(void *)shortOpt.field_2._8_8_,val._0_8_), iVar7 == 0)))) {
    __assert_fail("!starts_with(token, \"--\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/vendor/docopt/docopt.cpp"
                  ,0x121,"PatternList parse_short(Tokens &, std::vector<Option> &)");
  }
  if (local_58 != (Option *)pVVar1) {
    operator_delete(local_58);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (token._M_dataplus._M_p != (pointer)0x1) {
    pbVar12 = (byte *)(shortOpt.field_2._8_8_ + 1);
    paVar2 = &error.field_2;
    pbVar3 = &val.variant.boolValue + 8;
    local_120 = (vector<docopt::Option,std::allocator<docopt::Option>> *)options;
    do {
      local_f8 = (undefined1  [8])&shortOpt._M_string_length;
      shortOpt._M_string_length._0_2_ = (ushort)*pbVar12 << 8 | 0x2d;
      shortOpt._M_dataplus._M_p = (pointer)0x2;
      shortOpt._M_string_length._2_1_ = 0;
      token.field_2._8_8_ = 0;
      similar.super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pOVar5 = *(pointer *)(local_120 + 8);
      for (pOVar13 = *(pointer *)local_120; pvVar6 = local_120, pOVar13 != pOVar5;
          pOVar13 = pOVar13 + 1) {
        __n = (pointer)(pOVar13->fShortOption)._M_string_length;
        if ((__n == shortOpt._M_dataplus._M_p) &&
           ((__n == (pointer)0x0 ||
            (iVar7 = bcmp((pOVar13->fShortOption)._M_dataplus._M_p,(void *)local_f8,(size_t)__n),
            iVar7 == 0)))) {
          local_58 = pOVar13;
          if (similar.
              super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
              _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
            std::vector<docopt::Option_const*,std::allocator<docopt::Option_const*>>::
            _M_realloc_insert<docopt::Option_const*>
                      ((vector<docopt::Option_const*,std::allocator<docopt::Option_const*>> *)
                       (token.field_2._M_local_buf + 8),(iterator)0x0,&local_58);
          }
          else {
            *similar.
             super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
             _M_impl.super__Vector_impl_data._M_start = pOVar13;
            similar.
            super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 similar.
                 super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
      }
      if (8 < (ulong)((long)similar.
                            super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                            ._M_impl.super__Vector_impl_data._M_start - token.field_2._8_8_)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ," is specified ambiguously ");
        std::__cxx11::to_string
                  (&local_180,
                   (long)similar.
                         super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                         ._M_impl.super__Vector_impl_data._M_start - token.field_2._8_8_ >> 3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range2,&local_180);
        plVar9 = (long *)std::__cxx11::string::append((char *)&ret);
        local_58 = (Option *)*plVar9;
        pOVar11 = (Option *)(plVar9 + 2);
        if (local_58 == pOVar11) {
          val.variant.longValue = (long)(pOVar11->super_LeafPattern).super_Pattern._vptr_Pattern;
          val.variant.strValue._M_string_length = plVar9[3];
          local_58 = (Option *)&val.variant;
        }
        else {
          val.variant.longValue = (long)(pOVar11->super_LeafPattern).super_Pattern._vptr_Pattern;
        }
        val._0_8_ = plVar9[1];
        *plVar9 = (long)pOVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if (ret != (PatternList *)&error._M_string_length) {
          operator_delete(ret);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p);
        }
        if (__range2 !=
            (vector<docopt::Option,_std::allocator<docopt::Option>_> *)
            &o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete(__range2);
        }
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,(string *)&local_58);
        *(undefined ***)prVar10 = &PTR__runtime_error_00151770;
        __cxa_throw(prVar10,&Tokens::OptionError::typeinfo,std::runtime_error::~runtime_error);
      }
      pbVar12 = pbVar12 + 1;
      if ((pointer)token.field_2._8_8_ ==
          similar.
          super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_58 = (Option *)((ulong)local_58 & 0xffffffff00000000);
        std::vector<docopt::Option,std::allocator<docopt::Option>>::
        emplace_back<std::__cxx11::string&,char_const(&)[1],int>
                  (local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   (char (*) [1])0x144e14,(int *)&local_58);
        ret = (PatternList *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<docopt::Option,std::allocator<docopt::Option>,docopt::Option&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&error,(Option **)&ret,
                   (allocator<docopt::Option> *)&local_58,(Option *)(*(long *)(pvVar6 + 8) + -0x98))
        ;
        if (tokens->fIsParsingArgv == true) {
          local_58 = (Option *)CONCAT44(local_58._4_4_,1);
          val.kind._0_1_ = 1;
          docopt::LeafPattern::setValue((LeafPattern *)ret,(value *)&local_58);
          if ((int)local_58 == 4) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&val);
          }
          else if (((int)local_58 == 3) && ((bool *)val._0_8_ != pbVar3)) {
            operator_delete((void *)val._0_8_);
          }
        }
        local_58 = (Option *)ret;
        val._0_8_ = error._M_dataplus._M_p;
        if (error._M_dataplus._M_p != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(error._M_dataplus._M_p + 8) = *(int *)(error._M_dataplus._M_p + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(error._M_dataplus._M_p + 8) = *(int *)(error._M_dataplus._M_p + 8) + 1;
          }
        }
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        emplace_back<std::shared_ptr<docopt::Pattern>>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)__return_storage_ptr__,(shared_ptr<docopt::Pattern> *)&local_58);
        this = error._M_dataplus;
        if (val._0_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)val._0_8_);
          this = error._M_dataplus;
        }
      }
      else {
        __range2 = (vector<docopt::Option,_std::allocator<docopt::Option>_> *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<docopt::Option,std::allocator<docopt::Option>,docopt::Option_const&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&o,(Option **)&__range2,
                   (allocator<docopt::Option> *)&local_58,*(Option **)token.field_2._8_8_);
        local_58 = (Option *)((ulong)local_58 & 0xffffffff00000000);
        if (*(int *)&__range2[6].super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_0012aad7:
        }
        else {
          if (pbVar12 == (byte *)(token._M_dataplus._M_p + shortOpt.field_2._8_8_)) {
            psVar8 = Tokens::current_abi_cxx11_(tokens);
            if ((psVar8->_M_string_length == 0) ||
               (iVar7 = std::__cxx11::string::compare((char *)psVar8), iVar7 == 0)) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_f8," requires an argument");
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar10,(string *)&ret);
              *(undefined ***)prVar10 = &PTR__runtime_error_00151770;
              __cxa_throw(prVar10,&Tokens::OptionError::typeinfo,std::runtime_error::~runtime_error)
              ;
            }
            Tokens::pop_abi_cxx11_(&local_160,tokens);
            paVar4 = &local_160.field_2;
            ret = (PatternList *)CONCAT44(ret._4_4_,3);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p == paVar4) {
              error.field_2._8_8_ = local_160.field_2._8_8_;
              error._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              error._M_dataplus._M_p = local_160._M_dataplus._M_p;
            }
            error.field_2._M_allocated_capacity._1_7_ =
                 local_160.field_2._M_allocated_capacity._1_7_;
            error.field_2._M_local_buf[0] = local_160.field_2._M_local_buf[0];
            error._M_string_length = local_160._M_string_length;
            local_160._M_string_length = 0;
            local_160.field_2._M_local_buf[0] = '\0';
            local_160._M_dataplus._M_p = (pointer)paVar4;
            if ((int)local_58 == 4) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&val);
            }
            else if (((int)local_58 == 3) && ((bool *)val._0_8_ != pbVar3)) {
              operator_delete((void *)val._0_8_);
            }
            local_58 = (Option *)CONCAT44(local_58._4_4_,(int)ret);
            switch((int)ret) {
            case 1:
              val.kind._0_1_ = error._M_dataplus._M_p._0_1_;
              break;
            case 2:
              val._0_8_ = error._M_dataplus._M_p;
              break;
            case 3:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)error._M_dataplus._M_p == paVar2) {
                val.variant.strList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)error.field_2._8_8_;
                val._0_8_ = pbVar3;
              }
              else {
                val._0_8_ = error._M_dataplus._M_p;
              }
              val.variant.strValue._M_string_length = error.field_2._M_allocated_capacity;
              val.variant.longValue = error._M_string_length;
              error._M_string_length = 0;
              error.field_2._M_allocated_capacity =
                   error.field_2._M_allocated_capacity & 0xffffffffffffff00;
              error._M_dataplus._M_p = (pointer)paVar2;
              break;
            case 4:
              val._0_8_ = error._M_dataplus._M_p;
              val.variant.longValue = error._M_string_length;
              val.variant.strValue._M_string_length = error.field_2._M_allocated_capacity;
              error._M_dataplus._M_p = (pointer)0x0;
              error._M_string_length = 0;
              error.field_2._M_allocated_capacity = 0;
              break;
            default:
              goto switchD_0012a9b8_default;
            }
            if ((int)ret == 4) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&error);
            }
            else if (((int)ret == 3) &&
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)error._M_dataplus._M_p != paVar2)) {
              operator_delete(error._M_dataplus._M_p);
            }
switchD_0012a9b8_default:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar4) {
              operator_delete(local_160._M_dataplus._M_p);
            }
            goto LAB_0012aad7;
          }
          local_140 = &local_130;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)&local_140);
          ret = (PatternList *)CONCAT44(ret._4_4_,3);
          if (local_140 == &local_130) {
            error.field_2._8_8_ = uStack_128;
            error._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            error._M_dataplus._M_p = local_140;
          }
          error.field_2._M_allocated_capacity._1_7_ = uStack_12f;
          error.field_2._M_local_buf[0] = local_130;
          error._M_string_length = local_138;
          local_138 = 0;
          local_130 = '\0';
          if ((int)local_58 == 4) {
            local_140 = &local_130;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&val);
          }
          else {
            local_140 = &local_130;
            if (((int)local_58 == 3) && ((bool *)val._0_8_ != pbVar3)) {
              operator_delete((void *)val._0_8_);
            }
          }
          local_58 = (Option *)CONCAT44(local_58._4_4_,(int)ret);
          switch((int)ret) {
          case 1:
            val.kind._0_1_ = error._M_dataplus._M_p._0_1_;
            break;
          case 2:
            val._0_8_ = error._M_dataplus._M_p;
            break;
          case 3:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)error._M_dataplus._M_p == paVar2) {
              val.variant.strList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)error.field_2._8_8_;
              val._0_8_ = pbVar3;
            }
            else {
              val._0_8_ = error._M_dataplus._M_p;
            }
            val.variant.strValue._M_string_length = error.field_2._M_allocated_capacity;
            val.variant.longValue = error._M_string_length;
            error._M_string_length = 0;
            error.field_2._M_allocated_capacity =
                 error.field_2._M_allocated_capacity & 0xffffffffffffff00;
            error._M_dataplus._M_p = (pointer)paVar2;
            break;
          case 4:
            val._0_8_ = error._M_dataplus._M_p;
            val.variant.longValue = error._M_string_length;
            val.variant.strValue._M_string_length = error.field_2._M_allocated_capacity;
            error._M_dataplus._M_p = (pointer)0x0;
            error._M_string_length = 0;
            error.field_2._M_allocated_capacity = 0;
            break;
          default:
            goto switchD_0012a88c_default;
          }
          if ((int)ret == 4) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&error);
          }
          else if (((int)ret == 3) &&
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)error._M_dataplus._M_p != paVar2)) {
            operator_delete(error._M_dataplus._M_p);
          }
switchD_0012a88c_default:
          if (local_140 != &local_130) {
            operator_delete(local_140);
          }
          pbVar12 = (byte *)(token._M_dataplus._M_p + shortOpt.field_2._8_8_);
        }
        if (tokens->fIsParsingArgv == true) {
          if ((int)local_58 == 0) {
            ret = (PatternList *)CONCAT44(ret._4_4_,1);
            error._M_dataplus._M_p._0_1_ = 1;
          }
          else {
            ret = (PatternList *)CONCAT44(ret._4_4_,(int)local_58);
            switch((int)local_58) {
            case 1:
              error._M_dataplus._M_p._0_1_ = (undefined1)val.kind;
              break;
            case 2:
              error._M_dataplus._M_p = (pointer)val._0_8_;
              break;
            case 3:
              if ((bool *)val._0_8_ == pbVar3) {
                error.field_2._8_8_ =
                     val.variant.strList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                error._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                error._M_dataplus._M_p = (pointer)val._0_8_;
              }
              error.field_2._M_allocated_capacity = val.variant.strValue._M_string_length;
              error._M_string_length = val.variant.longValue;
              val.variant.longValue = 0;
              val.variant.strValue._M_string_length =
                   val.variant.strValue._M_string_length & 0xffffffffffffff00;
              val._0_8_ = pbVar3;
              break;
            case 4:
              error._M_dataplus._M_p = (pointer)val._0_8_;
              error._M_string_length = val.variant.longValue;
              error.field_2._M_allocated_capacity = val.variant.strValue._M_string_length;
              val.kind = Empty;
              val._4_4_ = 0;
              val.variant.longValue = 0;
              val.variant.strValue._M_string_length = 0;
            }
          }
          docopt::LeafPattern::setValue((LeafPattern *)__range2,(value *)&ret);
          if ((int)ret == 4) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&error);
          }
          else if (((int)ret == 3) &&
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)error._M_dataplus._M_p != paVar2)) {
            operator_delete(error._M_dataplus._M_p);
          }
        }
        ret = (PatternList *)__range2;
        error._M_dataplus._M_p =
             (pointer)o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar8 = &((o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_LeafPattern).fName;
            *(int *)&(psVar8->_M_dataplus)._M_p = *(int *)&(psVar8->_M_dataplus)._M_p + 1;
            UNLOCK();
          }
          else {
            psVar8 = &((o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_LeafPattern).fName;
            *(int *)&(psVar8->_M_dataplus)._M_p = *(int *)&(psVar8->_M_dataplus)._M_p + 1;
          }
        }
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        emplace_back<std::shared_ptr<docopt::Pattern>>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)__return_storage_ptr__,(shared_ptr<docopt::Pattern> *)&ret);
        if (error._M_dataplus._M_p != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)error._M_dataplus._M_p);
        }
        if ((int)local_58 == 4) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&val);
          this._M_p = (pointer)o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr;
        }
        else {
          this._M_p = (pointer)o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr;
          if (((int)local_58 == 3) && ((bool *)val._0_8_ != pbVar3)) {
            operator_delete((void *)val._0_8_);
            this._M_p = (pointer)o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr;
          }
        }
      }
      if ((element_type *)this._M_p != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_p);
      }
      if (token.field_2._8_8_ != 0) {
        operator_delete((void *)token.field_2._8_8_);
      }
      if (local_f8 != (undefined1  [8])&shortOpt._M_string_length) {
        operator_delete((void *)local_f8);
      }
    } while (pbVar12 != (byte *)(token._M_dataplus._M_p + shortOpt.field_2._8_8_));
  }
  if ((size_type *)shortOpt.field_2._8_8_ != &token._M_string_length) {
    operator_delete((void *)shortOpt.field_2._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

static PatternList parse_short(Tokens& tokens, std::vector<Option>& options)
{
	// shorts ::= '-' ( chars )* [ [ ' ' ] chars ] ;

	auto token = tokens.pop();

	assert(starts_with(token, "-"));
	assert(!starts_with(token, "--"));

	auto i = token.begin();
	++i; // skip the leading '-'

	PatternList ret;
	while (i != token.end()) {
		std::string shortOpt = { '-', *i };
		++i;

		std::vector<Option const*> similar;
		for(auto const& option : options) {
			if (option.shortOption()==shortOpt)
				similar.push_back(&option);
		}

		if (similar.size() > 1) {
			std::string error = shortOpt + " is specified ambiguously "
			+ std::to_string(similar.size()) + " times";
			throw Tokens::OptionError(std::move(error));
		} else if (similar.empty()) {
			options.emplace_back(shortOpt, "", 0);

			auto o = std::make_shared<Option>(options.back());
			if (tokens.isParsingArgv()) {
				o->setValue(value{true});
			}
			ret.push_back(o);
		} else {
			auto o = std::make_shared<Option>(*similar[0]);
			value val;
			if (o->argCount()) {
				if (i == token.end()) {
					// consume the next token
					auto const& ttoken = tokens.current();
					if (ttoken.empty() || ttoken=="--") {
						std::string error = shortOpt + " requires an argument";
						throw Tokens::OptionError(std::move(error));
					}
					val = tokens.pop();
				} else {
					// consume all the rest
					val = std::string{i, token.end()};
					i = token.end();
				}
			}

			if (tokens.isParsingArgv()) {
				o->setValue(val ? std::move(val) : value{true});
			}
			ret.push_back(o);
		}
	}

	return ret;
}